

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::Galactic2Observed
               (CESkyCoord *in_galactic,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_galactic,CEAngle *hour_angle)

{
  long in_R8;
  CESkyCoord obs_cirs;
  CESkyCoord tmp_cirs;
  CEAngle *in_stack_000001f8;
  CESkyCoord *in_stack_00000200;
  CEObserver *in_stack_00000208;
  CEDate *in_stack_00000210;
  CESkyCoord *in_stack_00000218;
  CESkyCoord *in_stack_00000220;
  CESkyCoord *out_galactic;
  CESkyCoord *in_stack_ffffffffffffff60;
  CESkyCoord *in_stack_ffffffffffffff80;
  CEDate *in_stack_ffffffffffffffa0;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *in_stack_ffffffffffffffb0;
  
  out_galactic = (CESkyCoord *)&stack0xffffffffffffffa0;
  CESkyCoord(in_stack_ffffffffffffff80);
  Galactic2CIRS(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  CESkyCoord(in_stack_ffffffffffffff80);
  CIRS2Observed(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
                in_stack_00000200,in_stack_000001f8);
  if (in_R8 != 0) {
    CIRS2Galactic(in_stack_ffffffffffffff60,out_galactic,(CEDate *)0x141e6c);
  }
  ~CESkyCoord(in_stack_ffffffffffffff60);
  ~CESkyCoord(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void CESkyCoord::Galactic2Observed(const CESkyCoord& in_galactic,
                                   CESkyCoord*       out_observed,
                                   const CEDate&     date,
                                   const CEObserver& observer,
                                   CESkyCoord*       observed_galactic,
                                   CEAngle*          hour_angle)
{
    // Galactic -> CIRS
    CESkyCoord tmp_cirs;
    Galactic2CIRS(in_galactic, &tmp_cirs, date);

    // CIRS -> OBSERVED
    CESkyCoord obs_cirs;
    CIRS2Observed(tmp_cirs, out_observed, date, 
                  observer, &obs_cirs, hour_angle);

    // Observed CIRS -> observed Galactic
    if (observed_galactic != nullptr) {
        CIRS2Galactic(obs_cirs, observed_galactic, date);
    }

    return;
}